

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O0

Fxch_Man_t * Fxch_ManAlloc(Vec_Wec_t *vCubes)

{
  int iVar1;
  Fxch_Man_t *pFVar2;
  Hsh_VecMan_t *pHVar3;
  Vec_Flt_t *pVVar4;
  Vec_Wec_t *pVVar5;
  Vec_Int_t *pVVar6;
  Fxch_Man_t *pFxchMan;
  Vec_Wec_t *vCubes_local;
  
  pFVar2 = (Fxch_Man_t *)calloc(1,0xd8);
  pFVar2->vCubes = vCubes;
  iVar1 = Vec_WecSize(vCubes);
  pFVar2->nCubesInit = iVar1;
  pHVar3 = Hsh_VecManStart(0x400);
  pFVar2->pDivHash = pHVar3;
  pVVar4 = Vec_FltAlloc(0x400);
  pFVar2->vDivWeights = pVVar4;
  pVVar5 = Vec_WecAlloc(0x400);
  pFVar2->vDivCubePairs = pVVar5;
  pVVar6 = Vec_IntAlloc(4);
  pFVar2->vCubeFree = pVVar6;
  pVVar6 = Vec_IntAlloc(4);
  pFVar2->vDiv = pVVar6;
  pVVar6 = Vec_IntAlloc(0x80);
  pFVar2->vCubesS = pVVar6;
  pVVar6 = Vec_IntAlloc(0x80);
  pFVar2->vPairs = pVVar6;
  pVVar6 = Vec_IntAlloc(0x40);
  pFVar2->vCubesToUpdate = pVVar6;
  pVVar6 = Vec_IntAlloc(0x40);
  pFVar2->vCubesToRemove = pVVar6;
  pVVar6 = Vec_IntAlloc(0x40);
  pFVar2->vSCC = pVVar6;
  return pFVar2;
}

Assistant:

Fxch_Man_t* Fxch_ManAlloc( Vec_Wec_t* vCubes )
{
    Fxch_Man_t* pFxchMan = ABC_CALLOC( Fxch_Man_t, 1 );

    pFxchMan->vCubes = vCubes;
    pFxchMan->nCubesInit = Vec_WecSize( vCubes );

    pFxchMan->pDivHash = Hsh_VecManStart( 1024 );
    pFxchMan->vDivWeights = Vec_FltAlloc( 1024 );
    pFxchMan->vDivCubePairs = Vec_WecAlloc( 1024 );

    pFxchMan->vCubeFree = Vec_IntAlloc( 4 );
    pFxchMan->vDiv = Vec_IntAlloc( 4 );

    pFxchMan->vCubesS = Vec_IntAlloc( 128 );
    pFxchMan->vPairs = Vec_IntAlloc( 128 );
    pFxchMan->vCubesToUpdate = Vec_IntAlloc( 64 );
    pFxchMan->vCubesToRemove = Vec_IntAlloc( 64 );
    pFxchMan->vSCC = Vec_IntAlloc( 64 );

    return pFxchMan;
}